

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outputtype.cpp
# Opt level: O0

optional<OutputType> ParseOutputType(string *type)

{
  __type_conflict2 _Var1;
  optional<OutputType> *in_RDI;
  long in_FS_OFFSET;
  OutputType *in_stack_ffffffffffffffd0;
  _Optional_payload_base<OutputType> in_stack_fffffffffffffff0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  
  __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
           (in_FS_OFFSET + 0x28);
  _Var1 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffff0);
  if (_Var1) {
    std::optional<OutputType>::optional<OutputType,_true>(in_RDI,in_stack_ffffffffffffffd0);
  }
  else {
    _Var1 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffff0);
    if (_Var1) {
      std::optional<OutputType>::optional<OutputType,_true>(in_RDI,in_stack_ffffffffffffffd0);
    }
    else {
      _Var1 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffff0);
      if (_Var1) {
        std::optional<OutputType>::optional<OutputType,_true>(in_RDI,in_stack_ffffffffffffffd0);
      }
      else {
        _Var1 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffffff0);
        if (_Var1) {
          std::optional<OutputType>::optional<OutputType,_true>(in_RDI,in_stack_ffffffffffffffd0);
        }
        else {
          std::optional<OutputType>::optional((optional<OutputType> *)&stack0xfffffffffffffff0);
        }
      }
    }
  }
  if (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_FS_OFFSET + 0x28)
      == __lhs) {
    return (optional<OutputType>)in_stack_fffffffffffffff0;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<OutputType> ParseOutputType(const std::string& type)
{
    if (type == OUTPUT_TYPE_STRING_LEGACY) {
        return OutputType::LEGACY;
    } else if (type == OUTPUT_TYPE_STRING_P2SH_SEGWIT) {
        return OutputType::P2SH_SEGWIT;
    } else if (type == OUTPUT_TYPE_STRING_BECH32) {
        return OutputType::BECH32;
    } else if (type == OUTPUT_TYPE_STRING_BECH32M) {
        return OutputType::BECH32M;
    }
    return std::nullopt;
}